

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

xmlRelaxNGDefinePtr_conflict
xmlRelaxNGParsePatterns(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr nodes,int group)

{
  xmlRelaxNGDefinePtr pxVar1;
  int iVar2;
  xmlRelaxNGDefinePtr_conflict pxVar3;
  xmlRelaxNGDefinePtr_conflict pxVar4;
  xmlRelaxNGDefinePtr_conflict pxVar5;
  xmlRelaxNGDefinePtr_conflict pxVar6;
  xmlRelaxNGDefinePtr_conflict pxVar7;
  
  if (nodes == (xmlNodePtr)0x0) {
LAB_001862a6:
    pxVar4 = (xmlRelaxNGDefinePtr_conflict)0x0;
  }
  else {
    pxVar1 = ctxt->def;
    pxVar6 = (xmlRelaxNGDefinePtr_conflict)0x0;
    pxVar7 = (xmlRelaxNGDefinePtr_conflict)0x0;
    do {
      if ((((nodes->ns == (xmlNs *)0x0) || (nodes->type != XML_ELEMENT_NODE)) ||
          (iVar2 = xmlStrEqual(nodes->name,"element"), iVar2 == 0)) ||
         (iVar2 = xmlStrEqual(nodes->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
         iVar2 == 0)) {
        pxVar5 = xmlRelaxNGParsePattern(ctxt,nodes);
        pxVar3 = pxVar6;
        pxVar4 = pxVar7;
        if ((pxVar5 != (xmlRelaxNGDefinePtr_conflict)0x0) &&
           (pxVar3 = pxVar5, pxVar4 = pxVar5, pxVar7 != (xmlRelaxNGDefinePtr_conflict)0x0)) {
          pxVar6->next = pxVar5;
          pxVar4 = pxVar7;
        }
      }
      else {
        pxVar3 = xmlRelaxNGParseElement(ctxt,nodes);
        if (pxVar3 == (xmlRelaxNGDefinePtr_conflict)0x0) goto LAB_001862a6;
        pxVar4 = pxVar3;
        if (pxVar7 != (xmlRelaxNGDefinePtr_conflict)0x0) {
          pxVar4 = pxVar7;
          if (((group == 1) && (pxVar7->type == XML_RELAXNG_ELEMENT)) && (pxVar7 == pxVar6)) {
            pxVar4 = xmlRelaxNGNewDefine(ctxt,nodes);
            if (pxVar4 == (xmlRelaxNGDefinePtr_conflict)0x0) goto LAB_001862a6;
            pxVar4->type = XML_RELAXNG_GROUP;
            pxVar4->content = pxVar6;
          }
          pxVar6->next = pxVar3;
        }
        pxVar3->parent = pxVar1;
      }
      pxVar6 = pxVar3;
      nodes = nodes->next;
      pxVar7 = pxVar4;
    } while (nodes != (_xmlNode *)0x0);
  }
  return pxVar4;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGParsePatterns(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr nodes,
                        int group)
{
    xmlRelaxNGDefinePtr def = NULL, last = NULL, cur, parent;

    parent = ctxt->def;
    while (nodes != NULL) {
        if (IS_RELAXNG(nodes, "element")) {
            cur = xmlRelaxNGParseElement(ctxt, nodes);
            if (cur == NULL)
                return (NULL);
            if (def == NULL) {
                def = last = cur;
            } else {
                if ((group == 1) && (def->type == XML_RELAXNG_ELEMENT) &&
                    (def == last)) {
                    def = xmlRelaxNGNewDefine(ctxt, nodes);
                    if (def == NULL)
                        return (NULL);
                    def->type = XML_RELAXNG_GROUP;
                    def->content = last;
                }
                last->next = cur;
                last = cur;
            }
            cur->parent = parent;
        } else {
            cur = xmlRelaxNGParsePattern(ctxt, nodes);
            if (cur != NULL) {
                if (def == NULL) {
                    def = last = cur;
                } else {
                    last->next = cur;
                    last = cur;
                }
            }
        }
        nodes = nodes->next;
    }
    return (def);
}